

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O1

ArrayBuilder<capnp::compiler::NodeTranslator::StructLayout::Group::DataLocationUsage> * __thiscall
kj::ArrayBuilder<capnp::compiler::NodeTranslator::StructLayout::Group::DataLocationUsage>::operator=
          (ArrayBuilder<capnp::compiler::NodeTranslator::StructLayout::Group::DataLocationUsage>
           *this,ArrayBuilder<capnp::compiler::NodeTranslator::StructLayout::Group::DataLocationUsage>
                 *other)

{
  DataLocationUsage *pDVar1;
  RemoveConst<capnp::compiler::NodeTranslator::StructLayout::Group::DataLocationUsage> *pRVar2;
  DataLocationUsage *pDVar3;
  
  pDVar1 = this->ptr;
  if (pDVar1 != (DataLocationUsage *)0x0) {
    pRVar2 = this->pos;
    pDVar3 = this->endPtr;
    this->ptr = (DataLocationUsage *)0x0;
    this->pos = (RemoveConst<capnp::compiler::NodeTranslator::StructLayout::Group::DataLocationUsage>
                 *)0x0;
    this->endPtr = (DataLocationUsage *)0x0;
    (**this->disposer->_vptr_ArrayDisposer)
              (this->disposer,pDVar1,8,(long)pRVar2 - (long)pDVar1 >> 3,
               (long)pDVar3 - (long)pDVar1 >> 3,0);
  }
  this->ptr = other->ptr;
  this->pos = other->pos;
  this->endPtr = other->endPtr;
  this->disposer = other->disposer;
  other->ptr = (DataLocationUsage *)0x0;
  other->pos = (RemoveConst<capnp::compiler::NodeTranslator::StructLayout::Group::DataLocationUsage>
                *)0x0;
  other->endPtr = (DataLocationUsage *)0x0;
  return this;
}

Assistant:

ArrayBuilder& operator=(ArrayBuilder&& other) {
    dispose();
    ptr = other.ptr;
    pos = other.pos;
    endPtr = other.endPtr;
    disposer = other.disposer;
    other.ptr = nullptr;
    other.pos = nullptr;
    other.endPtr = nullptr;
    return *this;
  }